

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RWBBlock.h
# Opt level: O3

pair<std::unique_ptr<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_>,_std::unique_ptr<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_>_>
 __thiscall dg::dda::RWBBlock::splitAround(RWBBlock *this,NodeT *node)

{
  pointer *this_00;
  NodesT *pNVar1;
  size_t *psVar2;
  RWSubgraph *pRVar3;
  pointer ppRVar4;
  pointer ppRVar5;
  RWNode *pRVar6;
  RWBBlock *s;
  _List_node_base *p_Var7;
  RWBBlock *s_00;
  _List_node_base *p_Var8;
  RWBBlock *pRVar9;
  pointer ppRVar10;
  uint uVar11;
  _Head_base<0UL,_dg::dda::RWBBlock_*,_false> in_RDX;
  pointer ppRVar12;
  _Tuple_impl<0UL,_dg::dda::RWBBlock_*,_std::default_delete<dg::dda::RWBBlock>_> extraout_RDX;
  RWBBlock *extraout_RDX_00;
  size_type __new_size;
  pointer ppRVar13;
  ElemWithEdges<dg::dda::RWBBlock> *this_01;
  _func_int **pp_Var14;
  pair<std::unique_ptr<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_>,_std::unique_ptr<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_>_>
  pVar15;
  
  if ((node->super_SubgraphNode<dg::dda::RWNode>)._predecessors.
      super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>._M_impl.
      super__Vector_impl_data._M_finish == (pointer)0x1) {
    *(undefined8 *)
     &(this->super_BBlockBase<dg::dda::RWBBlock,_dg::dda::RWNode>).
      super_CFGElement<dg::dda::RWBBlock> = 0;
    (this->super_BBlockBase<dg::dda::RWBBlock,_dg::dda::RWNode>).super_CFGElement<dg::dda::RWBBlock>
    .super_ElemWithEdges<dg::dda::RWBBlock>._successors.
    super__Vector_base<dg::dda::RWBBlock_*,_std::allocator<dg::dda::RWBBlock_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    goto LAB_0010edb4;
  }
  this_00 = &(node->super_SubgraphNode<dg::dda::RWNode>)._successors.
             super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  uVar11 = 0;
  for (pRVar6 = (RWNode *)*this_00;
      (pRVar6 != (RWNode *)this_00 &&
      ((_Tuple_impl<0UL,_dg::dda::RWBBlock_*,_std::default_delete<dg::dda::RWBBlock>_>)
       *(tuple<dg::dda::RWBBlock_*,_std::default_delete<dg::dda::RWBBlock>_> *)
        ((long)&pRVar6->super_SubgraphNode<dg::dda::RWNode> + 8) !=
       (_Tuple_impl<0UL,_dg::dda::RWBBlock_*,_std::default_delete<dg::dda::RWBBlock>_>)
       in_RDX._M_head_impl)); pRVar6 = (RWNode *)pRVar6->_vptr_RWNode) {
    uVar11 = uVar11 + 1;
  }
  pp_Var14 = pRVar6->_vptr_RWNode;
  if ((pointer *)pp_Var14 == this_00) {
    s = (RWBBlock *)0x0;
  }
  else {
    s = (RWBBlock *)operator_new(0x58);
    pRVar3 = (RWSubgraph *)
             (node->super_SubgraphNode<dg::dda::RWNode>)._predecessors.
             super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    ElemId::idcnt._0_4_ = (int)ElemId::idcnt + 1;
    (s->super_BBlockBase<dg::dda::RWBBlock,_dg::dda::RWNode>).super_CFGElement<dg::dda::RWBBlock>.
    super_ElemId.id = (int)ElemId::idcnt;
    (s->super_BBlockBase<dg::dda::RWBBlock,_dg::dda::RWNode>).super_CFGElement<dg::dda::RWBBlock>.
    super_ElemWithEdges<dg::dda::RWBBlock>._successors.
    super__Vector_base<dg::dda::RWBBlock_*,_std::allocator<dg::dda::RWBBlock_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    *(pointer *)
     ((long)&(s->super_BBlockBase<dg::dda::RWBBlock,_dg::dda::RWNode>).
             super_CFGElement<dg::dda::RWBBlock>.super_ElemWithEdges<dg::dda::RWBBlock>._successors.
             super__Vector_base<dg::dda::RWBBlock_*,_std::allocator<dg::dda::RWBBlock_*>_>._M_impl.
             super__Vector_impl_data + 8) = (pointer)0x0;
    *(pointer *)
     ((long)&(s->super_BBlockBase<dg::dda::RWBBlock,_dg::dda::RWNode>).
             super_CFGElement<dg::dda::RWBBlock>.super_ElemWithEdges<dg::dda::RWBBlock>._successors.
             super__Vector_base<dg::dda::RWBBlock_*,_std::allocator<dg::dda::RWBBlock_*>_>._M_impl.
             super__Vector_impl_data + 0x10) = (pointer)0x0;
    (s->super_BBlockBase<dg::dda::RWBBlock,_dg::dda::RWNode>).super_CFGElement<dg::dda::RWBBlock>.
    super_ElemWithEdges<dg::dda::RWBBlock>._predecessors.
    super__Vector_base<dg::dda::RWBBlock_*,_std::allocator<dg::dda::RWBBlock_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    *(pointer *)
     ((long)&(s->super_BBlockBase<dg::dda::RWBBlock,_dg::dda::RWNode>).
             super_CFGElement<dg::dda::RWBBlock>.super_ElemWithEdges<dg::dda::RWBBlock>.
             _predecessors.
             super__Vector_base<dg::dda::RWBBlock_*,_std::allocator<dg::dda::RWBBlock_*>_>._M_impl.
             super__Vector_impl_data + 8) = (pointer)0x0;
    *(pointer *)
     ((long)&(s->super_BBlockBase<dg::dda::RWBBlock,_dg::dda::RWNode>).
             super_CFGElement<dg::dda::RWBBlock>.super_ElemWithEdges<dg::dda::RWBBlock>.
             _predecessors.
             super__Vector_base<dg::dda::RWBBlock_*,_std::allocator<dg::dda::RWBBlock_*>_>._M_impl.
             super__Vector_impl_data + 0x10) = (pointer)0x0;
    pNVar1 = &(s->super_BBlockBase<dg::dda::RWBBlock,_dg::dda::RWNode>)._nodes;
    (s->super_BBlockBase<dg::dda::RWBBlock,_dg::dda::RWNode>)._nodes.
    super__List_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>._M_impl._M_node.
    super__List_node_base._M_prev = (_List_node_base *)pNVar1;
    (s->super_BBlockBase<dg::dda::RWBBlock,_dg::dda::RWNode>)._nodes.
    super__List_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>._M_impl._M_node.
    super__List_node_base._M_next = (_List_node_base *)pNVar1;
    (s->super_BBlockBase<dg::dda::RWBBlock,_dg::dda::RWNode>)._nodes.
    super__List_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>._M_impl._M_node._M_size
         = 0;
    s->subgraph = pRVar3;
    do {
      p_Var8 = (_List_node_base *)pp_Var14[2];
      p_Var7 = (_List_node_base *)operator_new(0x18);
      p_Var7[1]._M_next = p_Var8;
      std::__detail::_List_node_base::_M_hook(p_Var7);
      psVar2 = &(s->super_BBlockBase<dg::dda::RWBBlock,_dg::dda::RWNode>)._nodes.
                super__List_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>._M_impl.
                _M_node._M_size;
      *psVar2 = *psVar2 + 1;
      p_Var8[9]._M_prev = (_List_node_base *)s;
      pp_Var14 = (_func_int **)*pp_Var14;
    } while ((pointer *)pp_Var14 != this_00);
  }
  if (uVar11 == 0) {
    __new_size = 1;
    s_00 = (RWBBlock *)0x0;
  }
  else {
    s_00 = (RWBBlock *)operator_new(0x58);
    pRVar3 = (RWSubgraph *)
             (node->super_SubgraphNode<dg::dda::RWNode>)._predecessors.
             super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    ElemId::idcnt._0_4_ = (int)ElemId::idcnt + 1;
    (s_00->super_BBlockBase<dg::dda::RWBBlock,_dg::dda::RWNode>).super_CFGElement<dg::dda::RWBBlock>
    .super_ElemId.id = (int)ElemId::idcnt;
    (s_00->super_BBlockBase<dg::dda::RWBBlock,_dg::dda::RWNode>).super_CFGElement<dg::dda::RWBBlock>
    .super_ElemWithEdges<dg::dda::RWBBlock>._successors.
    super__Vector_base<dg::dda::RWBBlock_*,_std::allocator<dg::dda::RWBBlock_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    *(pointer *)
     ((long)&(s_00->super_BBlockBase<dg::dda::RWBBlock,_dg::dda::RWNode>).
             super_CFGElement<dg::dda::RWBBlock>.super_ElemWithEdges<dg::dda::RWBBlock>._successors.
             super__Vector_base<dg::dda::RWBBlock_*,_std::allocator<dg::dda::RWBBlock_*>_>._M_impl.
             super__Vector_impl_data + 8) = (pointer)0x0;
    *(pointer *)
     ((long)&(s_00->super_BBlockBase<dg::dda::RWBBlock,_dg::dda::RWNode>).
             super_CFGElement<dg::dda::RWBBlock>.super_ElemWithEdges<dg::dda::RWBBlock>._successors.
             super__Vector_base<dg::dda::RWBBlock_*,_std::allocator<dg::dda::RWBBlock_*>_>._M_impl.
             super__Vector_impl_data + 0x10) = (pointer)0x0;
    (s_00->super_BBlockBase<dg::dda::RWBBlock,_dg::dda::RWNode>).super_CFGElement<dg::dda::RWBBlock>
    .super_ElemWithEdges<dg::dda::RWBBlock>._predecessors.
    super__Vector_base<dg::dda::RWBBlock_*,_std::allocator<dg::dda::RWBBlock_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    *(pointer *)
     ((long)&(s_00->super_BBlockBase<dg::dda::RWBBlock,_dg::dda::RWNode>).
             super_CFGElement<dg::dda::RWBBlock>.super_ElemWithEdges<dg::dda::RWBBlock>.
             _predecessors.
             super__Vector_base<dg::dda::RWBBlock_*,_std::allocator<dg::dda::RWBBlock_*>_>._M_impl.
             super__Vector_impl_data + 8) = (pointer)0x0;
    *(pointer *)
     ((long)&(s_00->super_BBlockBase<dg::dda::RWBBlock,_dg::dda::RWNode>).
             super_CFGElement<dg::dda::RWBBlock>.super_ElemWithEdges<dg::dda::RWBBlock>.
             _predecessors.
             super__Vector_base<dg::dda::RWBBlock_*,_std::allocator<dg::dda::RWBBlock_*>_>._M_impl.
             super__Vector_impl_data + 0x10) = (pointer)0x0;
    pNVar1 = &(s_00->super_BBlockBase<dg::dda::RWBBlock,_dg::dda::RWNode>)._nodes;
    (s_00->super_BBlockBase<dg::dda::RWBBlock,_dg::dda::RWNode>)._nodes.
    super__List_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>._M_impl._M_node.
    super__List_node_base._M_prev = (_List_node_base *)pNVar1;
    (s_00->super_BBlockBase<dg::dda::RWBBlock,_dg::dda::RWNode>)._nodes.
    super__List_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>._M_impl._M_node.
    super__List_node_base._M_next = (_List_node_base *)pNVar1;
    (s_00->super_BBlockBase<dg::dda::RWBBlock,_dg::dda::RWNode>)._nodes.
    super__List_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>._M_impl._M_node._M_size
         = 0;
    s_00->subgraph = pRVar3;
    p_Var8 = (_List_node_base *)operator_new(0x18);
    p_Var8[1]._M_next = (_List_node_base *)in_RDX._M_head_impl;
    std::__detail::_List_node_base::_M_hook(p_Var8);
    psVar2 = &(s_00->super_BBlockBase<dg::dda::RWBBlock,_dg::dda::RWNode>)._nodes.
              super__List_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>._M_impl.
              _M_node._M_size;
    *psVar2 = *psVar2 + 1;
    *(RWBBlock **)((long)in_RDX._M_head_impl + 0x98) = s_00;
    __new_size = (size_type)uVar11;
  }
  std::__cxx11::list<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>::resize
            ((list<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_> *)this_00,__new_size);
  pRVar9 = s;
  if (s == (RWBBlock *)0x0) {
    pRVar9 = s_00;
  }
  ppRVar10 = *(pointer *)&node->super_SubgraphNode<dg::dda::RWNode>;
  ppRVar12 = (pointer)(node->super_SubgraphNode<dg::dda::RWNode>).data;
  if (ppRVar10 != ppRVar12) {
    do {
      ppRVar4 = *(pointer *)
                 ((long)&((*ppRVar10)->super_BBlockBase<dg::dda::RWBBlock,_dg::dda::RWNode>).
                         super_CFGElement<dg::dda::RWBBlock>.super_ElemWithEdges<dg::dda::RWBBlock>.
                         _predecessors.
                         super__Vector_base<dg::dda::RWBBlock_*,_std::allocator<dg::dda::RWBBlock_*>_>
                         ._M_impl.super__Vector_impl_data + 8);
      for (ppRVar13 = ((*ppRVar10)->super_BBlockBase<dg::dda::RWBBlock,_dg::dda::RWNode>).
                      super_CFGElement<dg::dda::RWBBlock>.super_ElemWithEdges<dg::dda::RWBBlock>.
                      _predecessors.
                      super__Vector_base<dg::dda::RWBBlock_*,_std::allocator<dg::dda::RWBBlock_*>_>.
                      _M_impl.super__Vector_impl_data._M_start; ppRVar13 != ppRVar4;
          ppRVar13 = ppRVar13 + 1) {
        if ((NodeT *)*ppRVar13 == node) {
          *ppRVar13 = pRVar9;
        }
      }
      ppRVar10 = ppRVar10 + 1;
    } while (ppRVar10 != ppRVar12);
    ppRVar10 = *(pointer *)&node->super_SubgraphNode<dg::dda::RWNode>;
    ppRVar12 = (pointer)(node->super_SubgraphNode<dg::dda::RWNode>).data;
  }
  this_01 = (ElemWithEdges<dg::dda::RWBBlock> *)&node->super_SubgraphNode<dg::dda::RWNode>;
  ppRVar13 = *(pointer *)
              ((long)&(pRVar9->super_BBlockBase<dg::dda::RWBBlock,_dg::dda::RWNode>).
                      super_CFGElement<dg::dda::RWBBlock>.super_ElemWithEdges<dg::dda::RWBBlock>.
                      _successors.
                      super__Vector_base<dg::dda::RWBBlock_*,_std::allocator<dg::dda::RWBBlock_*>_>.
                      _M_impl.super__Vector_impl_data + 0x10);
  *(void **)((long)&(pRVar9->super_BBlockBase<dg::dda::RWBBlock,_dg::dda::RWNode>).
                    super_CFGElement<dg::dda::RWBBlock>.super_ElemWithEdges<dg::dda::RWBBlock>.
                    _successors.
                    super__Vector_base<dg::dda::RWBBlock_*,_std::allocator<dg::dda::RWBBlock_*>_>.
                    _M_impl.super__Vector_impl_data + 0x10) =
       (node->super_SubgraphNode<dg::dda::RWNode>).user_data;
  ppRVar4 = (pRVar9->super_BBlockBase<dg::dda::RWBBlock,_dg::dda::RWNode>).
            super_CFGElement<dg::dda::RWBBlock>.super_ElemWithEdges<dg::dda::RWBBlock>._successors.
            super__Vector_base<dg::dda::RWBBlock_*,_std::allocator<dg::dda::RWBBlock_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppRVar5 = *(pointer *)
             ((long)&(pRVar9->super_BBlockBase<dg::dda::RWBBlock,_dg::dda::RWNode>).
                     super_CFGElement<dg::dda::RWBBlock>.super_ElemWithEdges<dg::dda::RWBBlock>.
                     _successors.
                     super__Vector_base<dg::dda::RWBBlock_*,_std::allocator<dg::dda::RWBBlock_*>_>.
                     _M_impl.super__Vector_impl_data + 8);
  (pRVar9->super_BBlockBase<dg::dda::RWBBlock,_dg::dda::RWNode>).super_CFGElement<dg::dda::RWBBlock>
  .super_ElemWithEdges<dg::dda::RWBBlock>._successors.
  super__Vector_base<dg::dda::RWBBlock_*,_std::allocator<dg::dda::RWBBlock_*>_>._M_impl.
  super__Vector_impl_data._M_start = ppRVar10;
  *(pointer *)
   ((long)&(pRVar9->super_BBlockBase<dg::dda::RWBBlock,_dg::dda::RWNode>).
           super_CFGElement<dg::dda::RWBBlock>.super_ElemWithEdges<dg::dda::RWBBlock>._successors.
           super__Vector_base<dg::dda::RWBBlock_*,_std::allocator<dg::dda::RWBBlock_*>_>._M_impl.
           super__Vector_impl_data + 8) = ppRVar12;
  *(pointer *)&node->super_SubgraphNode<dg::dda::RWNode> = ppRVar4;
  (node->super_SubgraphNode<dg::dda::RWNode>).data = ppRVar5;
  (node->super_SubgraphNode<dg::dda::RWNode>).user_data = ppRVar13;
  if (s_00 == (RWBBlock *)0x0) {
LAB_0010eda3:
    ElemWithEdges<dg::dda::RWBBlock>::addSuccessor(this_01,s);
    in_RDX._M_head_impl = extraout_RDX_00;
  }
  else {
    ElemWithEdges<dg::dda::RWBBlock>::addSuccessor(this_01,s_00);
    in_RDX = extraout_RDX.super__Head_base<0UL,_dg::dda::RWBBlock_*,_false>._M_head_impl;
    if (s != (RWBBlock *)0x0) {
      this_01 = &(s_00->super_BBlockBase<dg::dda::RWBBlock,_dg::dda::RWNode>).
                 super_CFGElement<dg::dda::RWBBlock>.super_ElemWithEdges<dg::dda::RWBBlock>;
      goto LAB_0010eda3;
    }
  }
  *(RWBBlock **)
   &(this->super_BBlockBase<dg::dda::RWBBlock,_dg::dda::RWNode>).super_CFGElement<dg::dda::RWBBlock>
       = s_00;
  (this->super_BBlockBase<dg::dda::RWBBlock,_dg::dda::RWNode>).super_CFGElement<dg::dda::RWBBlock>.
  super_ElemWithEdges<dg::dda::RWBBlock>._successors.
  super__Vector_base<dg::dda::RWBBlock_*,_std::allocator<dg::dda::RWBBlock_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)s;
LAB_0010edb4:
  pVar15.second._M_t.
  super___uniq_ptr_impl<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_>._M_t.
  super__Tuple_impl<0UL,_dg::dda::RWBBlock_*,_std::default_delete<dg::dda::RWBBlock>_>.
  super__Head_base<0UL,_dg::dda::RWBBlock_*,_false>._M_head_impl =
       (__uniq_ptr_data<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>,_true,_true>)
       (__uniq_ptr_data<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>,_true,_true>)
       in_RDX._M_head_impl;
  pVar15.first._M_t.
  super___uniq_ptr_impl<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_>._M_t.
  super__Tuple_impl<0UL,_dg::dda::RWBBlock_*,_std::default_delete<dg::dda::RWBBlock>_>.
  super__Head_base<0UL,_dg::dda::RWBBlock_*,_false>._M_head_impl =
       (__uniq_ptr_data<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>,_true,_true>)
       (__uniq_ptr_data<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>,_true,_true>)this;
  return pVar15;
}

Assistant:

std::pair<std::unique_ptr<RWBBlock>, std::unique_ptr<RWBBlock>>
    splitAround(NodeT *node) {
        assert(node->getBBlock() == this && "Spliting a block on invalid node");

        RWBBlock *withnode = nullptr;
        RWBBlock *after = nullptr;

        if (getNodes().size() == 1) {
            assert(*getNodes().begin() == node);
            return {nullptr, nullptr};
        }

#ifndef NDEBUG
        auto old_size = getNodes().size();
        assert(old_size > 1);
#endif
        unsigned num = 0;
        auto it = getNodes().begin(), et = getNodes().end();
        for (; it != et; ++it) {
            if (*it == node) {
                break;
            }
            ++num;
        }

        assert(it != et && "Did not find the node");
        assert(*it == node);

        ++it;
        if (it != et) {
            after = new RWBBlock(subgraph);
            for (; it != et; ++it) {
                after->append(*it);
            }
        }

        // truncate nodes in this block
        if (num > 0) {
            withnode = new RWBBlock(subgraph);
            withnode->append(node);

            getNodes().resize(num);
        } else {
            assert(*getNodes().begin() == node);
            assert(after && "Should have a suffix");
            getNodes().resize(1);
        }

        assert(!withnode || withnode->size() == 1);
        assert(((getNodes().size() + (withnode ? withnode->size() : 0) +
                 (after ? after->size() : 0)) == old_size) &&
               "Bug in splitting nodes");

        // reconnect edges
        RWBBlock *bbwithsuccessors = after;
        if (!bbwithsuccessors) // no suffix
            bbwithsuccessors = withnode;

        assert(bbwithsuccessors);
        for (auto *s : this->_successors) {
            for (auto &p : s->_predecessors) {
                if (p == this) {
                    p = bbwithsuccessors;
                }
            }
        }
        // swap this and after successors
        bbwithsuccessors->_successors.swap(this->_successors);

        if (withnode) {
            this->addSuccessor(withnode);
            if (after) {
                withnode->addSuccessor(after);
            }
        } else {
            assert(after && "Should have a suffix");
            this->addSuccessor(after);
        }

        return {std::unique_ptr<RWBBlock>(withnode),
                std::unique_ptr<RWBBlock>(after)};
    }